

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O0

dino_template_error_t
dino_template_generate_buffer
          (dino_string_ptr input_buffer,dino_string_ptr output_buffer,void *context_ptr,
          function_string_ptr_t function_string_ptr,function_boolean_ptr_t function_boolean_ptr)

{
  operator_type_t oVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  _Bool local_b1;
  operator_type_t operator_type;
  _Bool bool_value;
  size_t length_to_append;
  char *ptr_tag;
  dino_string_ptr symbol_buffer;
  char *ptr_EOF;
  char *ptr_in;
  pi_template_generator_t ptg_context;
  function_boolean_ptr_t function_boolean_ptr_local;
  function_string_ptr_t function_string_ptr_local;
  void *context_ptr_local;
  dino_string_ptr output_buffer_local;
  dino_string_ptr input_buffer_local;
  
  if ((((function_string_ptr == (function_string_ptr_t)0x0) ||
       (function_boolean_ptr == (function_boolean_ptr_t)0x0)) ||
      (output_buffer == (dino_string_ptr)0x0)) || (input_buffer == (dino_string_ptr)0x0)) {
    input_buffer_local._4_4_ = dino_template_invalid_input;
  }
  else {
    ptg_context._72_8_ = function_boolean_ptr;
    dino_string_reset(output_buffer);
    pi_template_generator_create
              ((pi_template_generator_t *)&ptr_in,output_buffer,context_ptr,
               (function_boolean_ptr_t)ptg_context._72_8_,function_string_ptr);
    pcVar2 = dino_string_c_ptr(input_buffer);
    ptr_EOF = pcVar2;
    sVar3 = dino_string_c_strlen(input_buffer);
    symbol_buffer = (dino_string_ptr)(pcVar2 + sVar3);
    if (*ptr_EOF == '%') {
      dino_string_append_char(output_buffer,*ptr_EOF);
      ptr_EOF = ptr_EOF + 1;
    }
    ptr_tag = (char *)dino_string_new();
    while (ptr_EOF < symbol_buffer) {
      length_to_append = (size_t)strchr(ptr_EOF,0x25);
      if ((char *)length_to_append == (char *)0x0) {
        pi_template_output((pi_template_generator_t *)&ptr_in,ptr_EOF);
        break;
      }
      length_to_append = length_to_append + -1;
      _operator_type =
           (char *)(length_to_append +
                   ((long)(int)((uint)(*(char *)length_to_append != '<') << 1) - (long)ptr_EOF));
      pi_template_output_length((pi_template_generator_t *)&ptr_in,ptr_EOF,(size_t)_operator_type);
      ptr_EOF = ptr_EOF + (long)_operator_type;
      if (*(char *)length_to_append == '<') {
        local_b1 = false;
        oVar1 = pi_template_lookup_symbol
                          ((pi_template_generator_t *)&ptr_in,ptr_EOF,(dino_string_ptr)ptr_tag,
                           &local_b1);
        switch(oVar1) {
        case operator_type_invalid:
        default:
          log_message(2,"dino_template_generate_buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                      ,0x16c,"Invalid Operator Type at offset %d.",
                      (long)symbol_buffer - (long)ptr_EOF);
          break;
        case operator_type_variable:
        case operator_type_output:
          pcVar2 = dino_string_c_ptr((dino_string_ptr)ptr_tag);
          pi_template_output((pi_template_generator_t *)&ptr_in,pcVar2);
          break;
        case operator_type_If:
          pi_template_push_if((pi_template_generator_t *)&ptr_in,(_Bool)(local_b1 & 1));
          break;
        case operator_type_Else:
          pi_template_push_else((pi_template_generator_t *)&ptr_in);
          break;
        case operator_type_EndIf:
          pi_template_pop_if((pi_template_generator_t *)&ptr_in);
        }
        if ((*ptr_EOF == '<') && (ptr_EOF[1] == '%')) {
          ptr_EOF = ptr_EOF + 2;
        }
        while( true ) {
          bVar4 = false;
          if (*ptr_EOF != '%') {
            bVar4 = *ptr_EOF != '\0';
          }
          if (!bVar4) break;
          ptr_EOF = ptr_EOF + 1;
        }
        if ((*ptr_EOF == '%') && (ptr_EOF[1] == '>')) {
          ptr_EOF = ptr_EOF + 2;
        }
      }
    }
    dino_string_delete((dino_string_ptr)ptr_tag,true);
    pi_template_generator_destroy((pi_template_generator_t *)&ptr_in);
    input_buffer_local._4_4_ = dino_template_no_error;
  }
  return input_buffer_local._4_4_;
}

Assistant:

dino_template_error_t dino_template_generate_buffer(dino_string_ptr input_buffer,
                                                    dino_string_ptr output_buffer,
                                                    void *context_ptr,
                                                    function_string_ptr_t function_string_ptr,
                                                    function_boolean_ptr_t function_boolean_ptr) {
    if (NULL == function_string_ptr
        || NULL == function_boolean_ptr
        || NULL == output_buffer
        || NULL == input_buffer) {
        return dino_template_invalid_input;
    }

    dino_string_reset(output_buffer);

    pi_template_generator_t ptg_context;

    pi_template_generator_create(&ptg_context,
                                 output_buffer,
                                 context_ptr,
                                 function_boolean_ptr,
                                 function_string_ptr);

    const char *ptr_in = dino_string_c_ptr(input_buffer);
    const char *ptr_EOF = ptr_in + dino_string_c_strlen(input_buffer);

    if (*ptr_in == '%') {
        dino_string_append_char(output_buffer, *ptr_in);
        ptr_in++;
    }

    dino_string_ptr symbol_buffer = dino_string_new();

    while (ptr_in < ptr_EOF) {
        //  Look for '%' and then see if we have a "<%"
        //  Initialization would have ensured that we wont crash...
        //
        const char *ptr_tag = strchr(ptr_in, '%');
        if (!ptr_tag) {
            //  No more tags, copy the rest of the data to the output
            //  buffer and break the loop.
            //
            pi_template_output(&ptg_context, ptr_in);
            break;
        }

        //  Set the ptr_tag to the beginning of the '<%' tag...
        ptr_tag--;

        size_t length_to_append = ptr_tag - ptr_in + 2 * (*ptr_tag != '<');

        pi_template_output_length(&ptg_context, ptr_in, length_to_append);

        ptr_in += length_to_append;
        if (*ptr_tag != '<') {
            continue;
        }

        bool bool_value = false;
        operator_type_t operator_type = pi_template_lookup_symbol(&ptg_context,
                                                                  ptr_in,
                                                                  symbol_buffer,
                                                                  &bool_value);
        switch (operator_type) {
            case operator_type_invalid:
            default:
                ERROR_LOG("Invalid Operator Type at offset %d.", ptr_EOF - ptr_in);
                break;
            case operator_type_variable:
            case operator_type_output:
                pi_template_output(&ptg_context, dino_string_c_ptr(symbol_buffer));
                break;

            case operator_type_If:
                pi_template_push_if(&ptg_context, bool_value);
                break;

            case operator_type_Else:
                pi_template_push_else(&ptg_context);
                break;

            case operator_type_EndIf:
                pi_template_pop_if(&ptg_context);
                break;
        }

        // Skip over opening <%
        //
        if (*ptr_in == '<' && *(ptr_in + 1) == '%') {
            ptr_in += 2;
        }

        // Skip to closing %>
        //
        while ('%' != *ptr_in && *ptr_in) {
            ptr_in++;
        }

        if (*ptr_in == '%' && *(ptr_in + 1) == '>') {
            ptr_in += 2;
        }
    }
    dino_string_delete(symbol_buffer, true);

    pi_template_generator_destroy(&ptg_context);
    return dino_template_no_error;
}